

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O2

ssize_t rtp_pkt_send(rtp_pkt_t *pkt,int fd)

{
  rtp_bits_t rVar1;
  uint uVar2;
  ssize_t sVar3;
  
  if (pkt != (rtp_pkt_t *)0x0) {
    rtp_pkt_pack(pkt);
    rVar1 = pkt->b;
    *(short *)&(pkt->b).field_0x2 = (short)(((uint)rVar1 & 0xffff0000) + 0x10000 >> 0x10);
    uVar2 = ((uint)rVar1 >> 2 & 0x3c) + (int)pkt->length + pkt->hlen;
    if (((uint)rVar1 & 4) != 0) {
      uVar2 = uVar2 + pkt->plen + 1;
    }
    sVar3 = send(fd,pkt->data,(ulong)uVar2,0);
    return sVar3;
  }
  __assert_fail("pkt != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                0x7f,"ssize_t rtp_pkt_send(rtp_pkt_t *, int)");
}

Assistant:

ssize_t rtp_pkt_send(rtp_pkt_t *pkt, int fd) {
  assert(pkt != NULL);
  
  rtp_pkt_pack(pkt);
  
  /*M
    Increment sequence number.
  **/
  pkt->b.seq++;

  unsigned int len = pkt->length + pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE;

  /*M
    If padding is 1, then we have signed the packet.
  **/
  if (pkt->b.p)
    len += pkt->plen + 1;

  /*M
    Send pack on \verb|fd|.
  **/
  return send(fd, pkt->data, len, 0);
}